

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack5_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  uVar1 = *in;
  auVar4 = vpbroadcastd_avx512vl();
  auVar5 = vpsrlvd_avx2(auVar4,_DAT_001a1d50);
  auVar3 = vpinsrd_avx(auVar4,uVar1 >> 5,1);
  auVar3 = vpunpcklqdq_avx(auVar3,auVar5);
  auVar5._8_4_ = 0x1f;
  auVar5._0_8_ = 0x1f0000001f;
  auVar5._12_4_ = 0x1f;
  auVar3 = vpand_avx(auVar3,auVar5);
  *(undefined1 (*) [16])out = auVar3;
  auVar3 = vpsrlvd_avx2(auVar4,_DAT_001a1d60);
  auVar3 = vpand_avx(auVar3,auVar5);
  *(long *)(out + 4) = auVar3._0_8_;
  out[6] = uVar1 >> 0x1e;
  uVar2 = in[1];
  out[6] = uVar1 >> 0x1e | (uVar2 & 7) << 2;
  out[7] = uVar2 >> 3 & 0x1f;
  return in + 2;
}

Assistant:

const uint32_t *__fastunpack5_8(const uint32_t *__restrict__ in,
                                uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 5);
  out++;
  *out = ((*in) >> 5) % (1U << 5);
  out++;
  *out = ((*in) >> 10) % (1U << 5);
  out++;
  *out = ((*in) >> 15) % (1U << 5);
  out++;
  *out = ((*in) >> 20) % (1U << 5);
  out++;
  *out = ((*in) >> 25) % (1U << 5);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 3)) << (5 - 3);
  out++;
  *out = ((*in) >> 3) % (1U << 5);
  out++;

  return in + 1;
}